

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narrow.h
# Opt level: O0

int lf::base::narrow<int,unsigned_long>(unsigned_long from)

{
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  int local_14;
  unsigned_long uStack_10;
  int to;
  unsigned_long from_local;
  
  local_14 = (int)from;
  if (((long)local_14 == from) && (-1 < local_14)) {
    return local_14;
  }
  uStack_10 = from;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Narrowing error.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,
             "static_cast<FROM>(to) == from && (std::is_signed_v<FROM> == std::is_signed_v<TO> || ((to < TO{}) == (from < FROM{})))"
             ,&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/narrow.h"
             ,&local_1e9);
  std::__cxx11::stringstream::str();
  AssertionFailed(&local_1c0,&local_1e8,0x26,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"false",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/narrow.h"
             ,&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_281);
  AssertionFailed(&local_230,&local_258,0x26,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  abort();
}

Assistant:

auto narrow(FROM from) noexcept -> TO {
  static_assert(std::is_arithmetic_v<TO>, "TO must be an arithmetic type");
  const TO to = static_cast<TO>(std::forward<FROM>(from));
  if constexpr (std::is_arithmetic_v<TO>) {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from &&
                      (std::is_signed_v<FROM> == std::is_signed_v<TO> ||
                       ((to < TO{}) == (from < FROM{}))),
                  "Narrowing error.");
  } else {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from, "Narrowing error.");
  }
  return to;
}